

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQNativeClosure * SQNativeClosure::Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)

{
  SQNativeClosure *pSVar1;
  SQUnsignedInteger in_RDX;
  SQFUNCTION in_RSI;
  SQSharedState *in_RDI;
  SQNativeClosure *unaff_retaddr;
  SQInteger n;
  SQNativeClosure *nc;
  SQInteger size;
  long local_30;
  
  pSVar1 = (SQNativeClosure *)sq_vm_malloc(0x11c411);
  SQNativeClosure(unaff_retaddr,in_RDI,in_RSI);
  pSVar1->_outervalues = (SQObjectPtr *)(pSVar1 + 1);
  pSVar1->_noutervalues = in_RDX;
  for (local_30 = 0; local_30 < (long)pSVar1->_noutervalues; local_30 = local_30 + 1) {
    ::SQObjectPtr::SQObjectPtr(pSVar1->_outervalues + local_30);
  }
  return pSVar1;
}

Assistant:

static SQNativeClosure *Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)
    {
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(nouters);
        SQNativeClosure *nc=(SQNativeClosure*)SQ_MALLOC(size);
        new (nc) SQNativeClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_noutervalues = nouters;
        _CONSTRUCT_VECTOR(SQObjectPtr,nc->_noutervalues,nc->_outervalues);
        return nc;
    }